

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_doclick(_glist *x,int xpos,int ypos,int which,int mod,int doit)

{
  undefined1 *puVar1;
  int iVar2;
  double dVar3;
  _glist *x_00;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int m;
  t_object *ptVar8;
  t_text *y;
  t_gobj *ptVar9;
  _glist *p_Var10;
  void *data;
  _outconnect *oc;
  _rtext *p_Var11;
  t_editor *ptVar12;
  byte bVar13;
  _instanceeditor *p_Var14;
  int iVar15;
  t_gobj **pptVar16;
  _rtext *p_Var17;
  undefined4 in_register_00000084;
  undefined8 uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  undefined4 extraout_XMM0_Db;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  int x1;
  undefined8 local_100;
  t_float local_f8;
  int y1;
  int y2;
  int x2;
  ulong local_e8;
  _glist *local_e0;
  undefined8 local_d8;
  _glist *local_c0;
  float local_b8;
  t_linetraverser t;
  
  uVar18 = CONCAT44(in_register_00000084,mod);
  x1 = 0;
  y1 = 0;
  x2 = 0;
  y2 = 0;
  ptVar12 = x->gl_editor;
  if (ptVar12 == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  uVar20 = (ulong)(uint)ypos;
  x_00 = (_glist *)(ulong)(uint)xpos;
  bVar21 = true;
  if ((which & 2U) == 0) {
    bVar21 = (x->field_0xe8 & 0x20) == 0;
  }
  p_Var14 = (pd_maininstance.pd_gui)->i_editor;
  *(undefined4 *)(p_Var14 + 0x40) = 0;
  local_d8 = (t_gobj *)0x0;
  local_b8 = 1.4013e-45;
  if (mod != 0) {
    if ((ptVar12->e_grab != (t_gobj *)0x0) && (ptVar12->e_keyfn != (t_glistkeyfn)0x0)) {
      local_e8 = uVar20;
      (*ptVar12->e_keyfn)(ptVar12->e_grab,&s_,0.0);
      ptVar9 = x->gl_editor->e_grab;
      if ((ptVar9 != (t_gobj *)0x0) &&
         ((ptVar8 = pd_checkobject(&ptVar9->g_pd), ptVar8 != (t_object *)0x0 &&
          ((~ptVar8->field_0x2e & 3) == 0)))) {
        gatom_undarken(ptVar8);
      }
      glist_grab(x,(t_gobj *)0x0,(t_glistmotionfn)0x0,(t_glistkeyfn)0x0,0,0);
      p_Var14 = (pd_maininstance.pd_gui)->i_editor;
      uVar20 = local_e8;
    }
    if (((*(int *)(p_Var14 + 0x50) == xpos) && (*(int *)(p_Var14 + 0x54) == (int)uVar20)) &&
       (dVar3 = sys_getrealtime(),
       dVar3 - *(double *)((pd_maininstance.pd_gui)->i_editor + 0x48) < 0.25)) {
      local_d8 = (t_gobj *)0x1;
      local_b8 = 4.2039e-45;
    }
  }
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 & 0xf7;
  if (mod != 0) {
    ptVar12 = x->gl_editor;
    ptVar12->e_grab = (t_gobj *)0x0;
    puVar1 = &ptVar12->field_0x88;
    *puVar1 = *puVar1 & 0xf8;
  }
  ptVar12 = x->gl_editor;
  if ((ptVar12->field_0x88 & 7) != 0) {
    return;
  }
  local_f8 = (t_float)(which & 1);
  ptVar12->e_xwas = xpos;
  iVar5 = (int)uVar20;
  ptVar12->e_ywas = iVar5;
  local_100 = uVar18;
  if (bVar21 && (char)((which & 8U) >> 3) == '\0') {
    if (ptVar12->e_textedfor != (_rtext *)0x0 && mod != 0) {
      y = rtext_getowner(ptVar12->e_textedfor);
      iVar4 = canvas_hitbox(x,&y->te_g,xpos,iVar5,&x1,&y1,&x2,&y2);
      iVar15 = y1;
      iVar6 = x1;
      p_Var17 = x->gl_editor->e_textedfor;
      if (iVar4 == 0) {
        rtext_retext(p_Var17);
        rtext_activate(x->gl_editor->e_textedfor,0);
        return;
      }
      fVar22 = 5.60519e-45;
      if (local_f8 == 0.0) {
        fVar22 = local_b8;
      }
      rtext_mouse(p_Var17,xpos - x1,iVar5 - y1,(int)fVar22);
      x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
      ptVar12 = x->gl_editor;
      ptVar12->e_xwas = iVar6;
      goto LAB_0013bfde;
    }
    pptVar16 = &x->gl_list;
    while (ptVar9 = *pptVar16, ptVar9 != (t_gobj *)0x0) {
      iVar6 = canvas_hitbox(x,ptVar9,xpos,iVar5,&x1,&y1,&x2,&y2);
      if (iVar6 != 0) {
        if (((which & 2U) == 0) || (uVar7 = 1, (x->field_0xe8 & 0x20) != 0)) {
          uVar7 = (which & 4U) >> 2;
        }
        uVar7 = gobj_click(ptVar9,x,xpos,iVar5,(int)local_f8,uVar7,(int)local_d8,(int)local_100);
        if (uVar7 != 0) {
          if ((t_float)local_100 != 0.0) {
            return;
          }
          goto LAB_0013c556;
        }
      }
      pptVar16 = &ptVar9->g_next;
    }
    if ((t_float)local_100 != 0.0) {
      return;
    }
  }
  else {
    ptVar9 = canvas_findhitbox(x,xpos,iVar5,&x1,&y1,&x2,&y2);
    if (ptVar9 != (t_gobj *)0x0) {
      ptVar8 = pd_checkobject(&ptVar9->g_pd);
      iVar6 = x2;
      if ((which & 8U) != 0) {
        canvas_rightclick(x,xpos,iVar5,ptVar9);
        return;
      }
      iVar15 = (int)(t_float)local_100;
      local_d8 = ptVar9;
      if (local_f8 != 0.0) {
        if ((t_float)local_100 == 0.0) {
          return;
        }
        if (((ptVar8 == (t_object *)0x0) ||
            (p_Var17 = x->gl_editor->e_textedfor, p_Var17 == (_rtext *)0x0)) ||
           (p_Var11 = glist_findrtext(x,ptVar8), p_Var17 != p_Var11)) {
          ptVar9 = local_d8;
          iVar5 = glist_isselected(x,local_d8);
          if (iVar5 != 0) {
            glist_deselect(x,ptVar9);
            return;
          }
          glist_select(x,ptVar9);
          return;
        }
        fVar22 = 5.60519e-45;
LAB_0013c7da:
        iVar15 = y1;
        iVar6 = x1;
        rtext_mouse(p_Var17,xpos - x1,iVar5 - y1,(int)fVar22);
        x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 5;
        ptVar12 = x->gl_editor;
        ptVar12->e_xwas = iVar6;
LAB_0013bfde:
        ptVar12->e_ywas = iVar15;
        return;
      }
      if ((xpos < x2 + -4) || (ptVar8 == (t_object *)0x0 || y2 + -4 <= iVar5)) {
        if (ptVar8 != (t_object *)0x0) goto LAB_0013c5d9;
        if ((t_float)local_100 != 0.0) goto LAB_0013c750;
      }
      else {
        if (((((ptVar8->te_g).g_pd)->c_wb == &text_widgetbehavior) ||
            ((~ptVar8->field_0x2e & 3) == 0)) ||
           (p_Var10 = pd_checkglist((t_pd *)ptVar8), p_Var10 != (_glist *)0x0)) {
          ptVar9 = local_d8;
          if (iVar15 != 0) {
            iVar6 = glist_isselected(x,local_d8);
            if (iVar6 == 0) {
              glist_noselect(x);
              glist_select(x,ptVar9);
            }
            x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 6;
            ptVar12 = x->gl_editor;
            ptVar12->e_xwas = x1;
            ptVar12->e_ywas = y1;
            ptVar12->e_xnew = xpos;
            ptVar12->e_ynew = iVar5;
            iVar5 = glist_getindex(x,ptVar9);
            data = canvas_undo_set_apply(x,iVar5);
            canvas_undo_add(x,UNDO_APPLY,"resize",data);
            return;
          }
          uVar7 = 7;
          goto LAB_0013c556;
        }
LAB_0013c5d9:
        iVar4 = obj_noutlets(ptVar8);
        if ((iVar4 != 0) && (iVar2 = x->gl_zoom, y2 + iVar2 * -2 <= iVar5)) {
          iVar6 = iVar6 - x1;
          iVar19 = 1;
          if (1 < iVar4) {
            iVar19 = iVar4 + -1;
          }
          m = (iVar6 / 2 + (xpos - x1) * iVar19) / iVar6;
          iVar15 = (int)(t_float)local_100;
          if (((m < iVar4) &&
              (iVar6 = ((iVar2 * -7 + iVar6) * m) / iVar19 + x1, iVar6 - iVar2 <= xpos)) &&
             (xpos <= iVar6 + iVar2 * 8)) {
            if ((t_float)local_100 != 0.0) {
              iVar6 = obj_issignaloutlet(ptVar8,m);
              x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8 | 2;
              ptVar12 = x->gl_editor;
              ptVar12->e_xwas = xpos;
              ptVar12->e_ywas = iVar5;
              pdgui_vmess("::pdtk_canvas::cords_to_foreground","ci",x,0);
              pdgui_vmess((char *)0x0,"crr iiii ri rs",x,"create","line",x_00,uVar20,x_00,uVar20,
                          "-width",(ulong)(uint)(x->gl_zoom << (iVar6 != 0)),"-tags","x");
              return;
            }
            uVar7 = 5;
            goto LAB_0013c556;
          }
        }
        if (iVar15 != 0) {
          p_Var17 = x->gl_editor->e_textedfor;
          if ((p_Var17 == (_rtext *)0x0) ||
             (p_Var11 = glist_findrtext(x,ptVar8), fVar22 = local_b8, p_Var17 != p_Var11)) {
LAB_0013c750:
            ptVar9 = local_d8;
            iVar5 = glist_isselected(x,local_d8);
            if (iVar5 == 0) {
              glist_noselect(x);
              glist_select(x,ptVar9);
            }
            ptVar12 = x->gl_editor;
            bVar13 = (ptVar12->field_0x88 & 0xf8) + 1;
LAB_0013c789:
            ptVar12->field_0x88 = bVar13;
            return;
          }
          goto LAB_0013c7da;
        }
      }
      uVar7 = 4;
      goto LAB_0013c556;
    }
    if ((which & 8U) == 0) {
      if (!bVar21) {
        if ((which & 4U) == 0) {
          local_d8 = (t_gobj *)CONCAT44(extraout_XMM0_Db,(float)xpos);
          local_b8 = (float)iVar5;
          local_e8 = uVar20;
          local_e0 = x;
          local_c0 = glist_getcanvas(x_00);
          linetraverser_start(&t,local_c0);
          while (oc = linetraverser_next(&t), p_Var10 = local_c0, x = local_e0, uVar20 = local_e8,
                oc != (_outconnect *)0x0) {
            fVar22 = (float)t.tr_lx2 - (float)t.tr_lx1;
            fVar23 = local_b8 - (float)t.tr_ly1;
            fVar24 = (float)local_d8 - (float)t.tr_lx1;
            fVar25 = (float)t.tr_ly2 - (float)t.tr_ly1;
            fVar26 = fVar22 * fVar23 + fVar24 * -fVar25;
            if (((fVar26 * fVar26 < (fVar22 * fVar22 + fVar25 * fVar25) * 50.0) &&
                (0.0 <= fVar24 * fVar22 + fVar23 * fVar25)) &&
               (0.0 <= ((float)t.tr_lx2 - (float)local_d8) * fVar22 +
                       ((float)t.tr_ly2 - local_b8) * fVar25)) {
              iVar5 = canvas_getindex(local_c0,&(t.tr_ob)->te_g);
              iVar6 = canvas_getindex(p_Var10,&(t.tr_ob2)->te_g);
              p_Var10 = local_e0;
              if (local_f8 == 0.0) {
                if ((t_float)local_100 != 0.0) {
                  glist_noselect(local_e0);
                  glist_selectline(local_c0,oc,iVar5,t.tr_outno,iVar6,t.tr_inno);
                }
                goto LAB_0013c945;
              }
              ptVar12 = local_e0->gl_editor;
              if ((ptVar12->field_0x88 & 0x20) == 0) {
                if ((t_float)local_100 != 0.0) {
                  glist_selectline(local_c0,oc,iVar5,t.tr_outno,iVar6,t.tr_inno);
                }
                goto LAB_0013c945;
              }
              iVar15 = ptVar12->e_selectline_index1;
              iVar4 = ptVar12->e_selectline_outno;
              iVar2 = ptVar12->e_selectline_index2;
              iVar19 = ptVar12->e_selectline_inno;
              if (((iVar5 == iVar15) && (iVar6 == iVar2)) &&
                 ((iVar4 == t.tr_outno && (iVar19 == t.tr_inno)))) {
                if ((t_float)local_100 != 0.0) {
                  glist_deselectline(local_e0);
                }
                goto LAB_0013c945;
              }
              if ((ptVar12->e_selection == (t_selection *)0x0) &&
                 (iVar5 == iVar15 || iVar6 == iVar2)) {
                if ((t_float)local_100 != 0.0) {
                  local_e8._0_4_ = (t_float)iVar5;
                  canvas_undo_add(local_e0,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
                  local_d8 = (t_gobj *)CONCAT44(local_d8._4_4_,(float)iVar15);
                  local_100 = CONCAT44(local_100._4_4_,(float)iVar4);
                  local_f8 = (t_float)iVar2;
                  local_b8 = (float)iVar19;
                  canvas_disconnect_with_undo(p_Var10,(float)iVar15,(float)iVar4,local_f8,local_b8);
                  fVar22 = (float)(int)(t_float)local_e8;
                  local_c0 = (_glist *)CONCAT44(local_c0._4_4_,fVar22);
                  local_e8 = CONCAT44(local_e8._4_4_,(float)iVar6);
                  canvas_disconnect_with_undo
                            (p_Var10,fVar22,(float)t.tr_outno,(float)iVar6,(float)t.tr_inno);
                  canvas_connect_with_undo
                            (p_Var10,local_c0._0_4_,(float)t.tr_outno,local_f8,local_b8);
                  canvas_connect_with_undo
                            (p_Var10,(float)local_d8,(t_float)local_100,(t_float)local_e8,
                             (float)t.tr_inno);
                  canvas_undo_add(p_Var10,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
                  ptVar12 = p_Var10->gl_editor;
                  ptVar12->e_selectline_index1 = iVar15;
                  ptVar12->e_selectline_outno = iVar4;
                  ptVar12->e_selectline_index2 = iVar6;
                  ptVar12->e_selectline_inno = t.tr_inno;
                  canvas_dirty(p_Var10,1.0);
                  p_Var10 = local_e0;
                }
LAB_0013c945:
                canvas_setcursor(p_Var10,6);
                return;
              }
            }
          }
        }
        canvas_setcursor(x,4);
        if ((t_float)local_100 == 0.0) {
          return;
        }
        if (local_f8 == 0.0) {
          glist_noselect(x);
        }
        pdgui_vmess((char *)0x0,"crr iiii rs",x,"create","rectangle",x_00,uVar20,x_00,uVar20,"-tags"
                    ,"x");
        ptVar12 = x->gl_editor;
        ptVar12->e_xwas = xpos;
        ptVar12->e_ywas = (int)uVar20;
        bVar13 = ptVar12->field_0x88 & 0xf8 | 3;
        goto LAB_0013c789;
      }
    }
    else {
      canvas_rightclick(x,xpos,iVar5,(t_gobj *)0x0);
    }
  }
  uVar7 = 0;
LAB_0013c556:
  canvas_setcursor(x,uVar7);
  return;
}

Assistant:

static void canvas_doclick(t_canvas *x, int xpos, int ypos, int which,
    int mod, int doit)
{
    t_gobj *hitbox;
    int shiftmod, runmode, altmod, doublemod = 0, rightclick;
    int x1=0, y1=0, x2=0, y2=0, clickreturned = 0;
    t_text *hitobj;

    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    shiftmod = (mod & SHIFTMOD);
    runmode = ((mod & CTRLMOD) || (!x->gl_edit));
    altmod = (mod & ALTMOD);
    rightclick = (mod & RIGHTCLICK);

    EDITOR->canvas_undo_already_set_move = 0;

        /* if keyboard was grabbed, notify grabber and cancel the grab */
    if (doit && x->gl_editor->e_grab && x->gl_editor->e_keyfn)
    {
        (* x->gl_editor->e_keyfn) (x->gl_editor->e_grab, &s_, 0);
        undarken_if_gatom(x->gl_editor->e_grab);
        glist_grab(x, 0, 0, 0, 0, 0);
    }

    if (doit && xpos == EDITOR->canvas_upx &&
        ypos == EDITOR->canvas_upy &&
        sys_getrealtime() - EDITOR->canvas_upclicktime < DCLICKINTERVAL)
            doublemod = 1;
    x->gl_editor->e_lastmoved = 0;
    if (doit)
    {
        x->gl_editor->e_grab = 0;
        x->gl_editor->e_onmotion = MA_NONE;
    }
#if 0
    post("click %d %d %d %d", xpos, ypos, which, mod);
#endif

    if (x->gl_editor->e_onmotion != MA_NONE)
        return;

    x->gl_editor->e_xwas = xpos;
    x->gl_editor->e_ywas = ypos;

    if (runmode && !rightclick)
    {
            /* is a text activated ? */
        if (x->gl_editor->e_textedfor  && doit)
        {
            hitobj = rtext_getowner(x->gl_editor->e_textedfor);
            if (canvas_hitbox(x, &hitobj->te_g,
                xpos, ypos, &x1, &y1, &x2, &y2))
            {
                rtext_mouse(x->gl_editor->e_textedfor, xpos - x1, ypos - y1,
                    (shiftmod? RTEXT_SHIFT :
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN)));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
            }
            else
            {
                rtext_retext(x->gl_editor->e_textedfor);
                rtext_activate(x->gl_editor->e_textedfor, 0);
            }
            return;
        }
        for (hitbox = x->gl_list; hitbox; hitbox = hitbox->g_next)
        {
                /* check if the object wants to be clicked */
            if (canvas_hitbox(x, hitbox, xpos, ypos, &x1, &y1, &x2, &y2)
                && (clickreturned = gobj_click(hitbox, x, xpos, ypos,
                    shiftmod, ((mod & CTRLMOD) && (!x->gl_edit)) || altmod,
                        doublemod, doit)))
                            break;
        }
        if (!doit)
        {
            if (hitbox)
                canvas_setcursor(x, clickreturned);
            else canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        }
        return;
    }
        /* if not a runmode left click, fall here. */
    hitbox = canvas_findhitbox(x, xpos, ypos, &x1, &y1, &x2, &y2);
    hitobj = (hitbox ? pd_checkobject(&hitbox->g_pd) : 0);
        /* if text is activated while we're in locked state, this must
        be a number box - so if we clicked outside the box, deactivate it.
        This is a different situation from the "deselect" action below
        when we're unlocked.  */
    /* if (doit) post("%d %x %x %x", x->gl_edit, x->gl_editor->e_textedfor,
        hitobj, (hitobj ? glist_findrtext(x, hitobj) : 0));
    if (doit && (!x->gl_edit) && x->gl_editor->e_textedfor &&
        (!hitobj || (glist_findrtext(x, hitobj) != x->gl_editor->e_textedfor)))
            rtext_activate(x->gl_editor->e_textedfor, 0);   */
    if (hitbox)
    {
            /* we're in a rectangle */
        if (rightclick)
            canvas_rightclick(x, xpos, ypos, hitbox);
        else if (shiftmod)
        {
            if (doit)
            {
                t_rtext *rt;
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1, RTEXT_SHIFT);
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                    if (glist_isselected(x, hitbox))
                        glist_deselect(x, hitbox);
                    else glist_select(x, hitbox);
                }
            }
        }
        else
        {
            int noutlet;
                /* resize? only for "true" text boxes or canvases */
            if (xpos >= x2-4 && ypos < y2-4 && hitobj &&
                    (hitobj->te_pd->c_wb == &text_widgetbehavior ||
                    hitobj->te_type == T_ATOM ||
                    pd_checkglist(&hitobj->te_pd)))
            {
                if (doit)
                {
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_RESIZE;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                    x->gl_editor->e_xnew = xpos;
                    x->gl_editor->e_ynew = ypos;
                    canvas_undo_add(x, UNDO_APPLY, "resize",
                        canvas_undo_set_apply(x, glist_getindex(x, hitbox)));
                }
                else canvas_setcursor(x, CURSOR_EDITMODE_RESIZE);
            }
                /* look for an outlet */
            else if (hitobj && (noutlet = obj_noutlets(hitobj)) &&
                ypos >= y2 - (OHEIGHT*x->gl_zoom) + x->gl_zoom)
            {
                int width = x2 - x1;
                int iow = IOWIDTH * x->gl_zoom;
                int nout1 = (noutlet > 1 ? noutlet - 1 : 1);
                int closest = ((xpos-x1) * (nout1) + width/2)/width;
                int hotspot = x1 +
                    (width - iow) * closest / (nout1);
                if (closest < noutlet &&
                    xpos >= (hotspot - x->gl_zoom) &&
                    xpos <= hotspot + (iow + x->gl_zoom))
                {
                    if (doit)
                    {
                        int issignal = obj_issignaloutlet(hitobj, closest);
                        x->gl_editor->e_onmotion = MA_CONNECT;
                        x->gl_editor->e_xwas = xpos;
                        x->gl_editor->e_ywas = ypos;
                        pdgui_vmess("::pdtk_canvas::cords_to_foreground", "ci", x, 0);
                        pdgui_vmess(0, "crr iiii ri rs",
                            x, "create", "line",
                            xpos,ypos, xpos,ypos,
                            "-width", (issignal ? 2 : 1) * x->gl_zoom,
                            "-tags", "x");
                    }
                    else canvas_setcursor(x, CURSOR_EDITMODE_CONNECT);
                }
                else if (doit)
                    goto nooutletafterall;
                else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
            }
                /* not in an outlet; select and move */
            else if (doit)
            {
                t_rtext *rt;
                    /* check if the box is being text edited */
            nooutletafterall:
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1,
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                        /* otherwise select and drag to displace */
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_MOVE;
                }
            }
            else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
        }
        return;
    }
        /* if right click doesn't hit any boxes, call rightclick
           routine anyway */
    if (rightclick)
        canvas_rightclick(x, xpos, ypos, 0);

        /* if not an editing action, and if we didn't hit a
           box, set cursor and return */
    if (runmode || rightclick)
    {
        canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        return;
    }
        /* having failed to find a box, we try lines now. */
    if (!runmode && !altmod)
    {
        t_linetraverser t;
        t_outconnect *oc;
        t_float fx = xpos, fy = ypos;
        t_glist *glist2 = glist_getcanvas(x);
        linetraverser_start(&t, glist2);
        while ((oc = linetraverser_next(&t)))
        {
            int outindex, inindex;
            t_float lx1 = t.tr_lx1, ly1 = t.tr_ly1,
                lx2 = t.tr_lx2, ly2 = t.tr_ly2;
            t_float area = (lx2 - lx1) * (fy - ly1) -
                (ly2 - ly1) * (fx - lx1);
            t_float dsquare = (lx2-lx1) * (lx2-lx1) + (ly2-ly1) * (ly2-ly1);
            if (area * area >= 50 * dsquare) continue;
            if ((lx2-lx1) * (fx-lx1) + (ly2-ly1) * (fy-ly1) < 0) continue;
            if ((lx2-lx1) * (lx2-fx) + (ly2-ly1) * (ly2-fy) < 0) continue;
            outindex = canvas_getindex(glist2, &t.tr_ob->ob_g);
            inindex = canvas_getindex(glist2, &t.tr_ob2->ob_g);
            if (shiftmod)
            {
                int soutindex, sinindex, soutno, sinno;
                    /* if no line is selected, just add this line to the selection */
                if(!x->gl_editor->e_selectedline)
                {
                    if (doit)
                    {
                        glist_selectline(glist2, oc,
                            outindex, t.tr_outno,
                            inindex, t.tr_inno);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
                soutindex = x->gl_editor->e_selectline_index1;
                sinindex = x->gl_editor->e_selectline_index2;
                soutno = x->gl_editor->e_selectline_outno;
                sinno = x->gl_editor->e_selectline_inno;
                        /* if the hovered line is already selected, deselect it */
                if ((outindex == soutindex) && (inindex == sinindex)
                    && (soutno == t.tr_outno) && (sinno == t.tr_inno))
                {
                    if(doit)
                        glist_deselectline(x);
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }

                    /* swap selected and hovered connection */
                if ((!x->gl_editor->e_selection)
                    && ((outindex == soutindex) || (inindex == sinindex)))
                {
                    if(doit)
                    {
                        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                        canvas_disconnect_with_undo(x, soutindex, soutno, sinindex, sinno);
                        canvas_disconnect_with_undo(x, outindex, t.tr_outno, inindex, t.tr_inno);
                        canvas_connect_with_undo(x, outindex, t.tr_outno, sinindex, sinno);
                        canvas_connect_with_undo(x, soutindex, soutno, inindex, t.tr_inno);
                        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);

                        x->gl_editor->e_selectline_index1 = soutindex;
                        x->gl_editor->e_selectline_outno = soutno;
                        x->gl_editor->e_selectline_index2 = inindex;
                        x->gl_editor->e_selectline_inno = t.tr_inno;

                        canvas_dirty(x, 1);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
            }
            if (!shiftmod)
            {
                    /* !shiftmode: clear selection before selecting line */
                if (doit)
                {
                    glist_noselect(x);
                    glist_selectline(glist2, oc,
                        outindex, t.tr_outno,
                        inindex, t.tr_inno);
                }
                canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                return;
            }
        }
    }
    canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
    if (doit)
    {
        if (!shiftmod) glist_noselect(x);
        pdgui_vmess(0, "crr iiii rs",
            x, "create", "rectangle",
            xpos,ypos, xpos,ypos,
            "-tags", "x");
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
        x->gl_editor->e_onmotion = MA_REGION;
    }
}